

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::CompleteCubeExtraLevelCase::createTexture(CompleteCubeExtraLevelCase *this)

{
  uint height;
  uint uVar1;
  uint uVar2;
  GLenum GVar3;
  uint uVar4;
  GLsizei height_00;
  GLsizei width;
  uint uVar5;
  long lVar6;
  bool bVar7;
  GLuint texture;
  TextureLevel levelData;
  PixelBufferAccess local_70;
  TextureFormat fmt;
  undefined1 local_40 [16];
  
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  uVar5 = *(uint *)&(this->super_TexCubeCompletenessCase).field_0x84;
  uVar2 = 0x20;
  uVar4 = 0x20;
  if (uVar5 != 0) {
    uVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  height = *(uint *)&this->field_0x88;
  if (height != 0) {
    uVar2 = 0x1f;
    if (height != 0) {
      for (; height >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  uVar1 = 0x1f - uVar2;
  if ((int)(0x1f - uVar2) < (int)(0x1f - uVar4)) {
    uVar1 = 0x1f - uVar4;
  }
  tcu::TextureLevel::setSize(&levelData,uVar5,height,1);
  tcu::TextureLevel::getAccess(&local_70,&levelData);
  local_40._0_4_ = 0.0;
  local_40._4_4_ = 0.0;
  local_40._8_8_ = &DAT_3f8000003f800000;
  tcu::clear(&local_70,(Vec4 *)local_40);
  if (uVar1 < 0x7fffffff) {
    uVar5 = 0;
    do {
      width = *(int *)&(this->super_TexCubeCompletenessCase).field_0x84 >> ((byte)uVar5 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height_00 = *(int *)&this->field_0x88 >> ((byte)uVar5 & 0x1f);
      if (height_00 < 2) {
        height_00 = 1;
      }
      lVar6 = 0;
      do {
        GVar3 = *(GLenum *)((long)&s_cubeTargets + lVar6);
        tcu::TextureLevel::getAccess(&local_70,&levelData);
        glwTexImage2D(GVar3,uVar5,0x1908,width,height_00,0,0x1908,0x1401,
                      local_70.super_ConstPixelBufferAccess.m_data);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x18);
      bVar7 = uVar5 != uVar1;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  lVar6 = 0;
  do {
    GVar3 = *(GLenum *)((long)&s_cubeTargets + lVar6);
    tcu::TextureLevel::getAccess(&local_70,&levelData);
    glwTexImage2D(GVar3,uVar1 + 2,0x1908,1,1,0,0x1908,0x1401,
                  local_70.super_ConstPixelBufferAccess.m_data);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x18);
  (this->super_TexCubeCompletenessCase).m_compareColor.m_value = 0xffff0000;
  GVar3 = glwGetError();
  glu::checkError(GVar3,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x378);
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void CompleteCubeExtraLevelCase::createTexture (void)
{
	tcu::TextureFormat		fmt				= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel		levelData		(fmt);

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	levelData.setSize(m_size.x(), m_size.y());
	clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int	levelW = de::max(1, m_size.x() >> levelNdx);
		int	levelH = de::max(1, m_size.y() >> levelNdx);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
			glTexImage2D(s_cubeTargets[targetNdx], levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	// Specify extra level.
	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
		glTexImage2D(s_cubeTargets[targetNdx], numLevels+1, GL_RGBA, 1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());

	m_compareColor = RGBA(0,0,255,255);

	GLU_CHECK_MSG("Set texturing state");
}